

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example0.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  ostream *poVar9;
  byte bVar10;
  byte bVar11;
  char *pcVar12;
  byte bVar13;
  char *pcVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  double dVar18;
  allocator<char> local_fb3;
  byte local_fb2;
  byte local_fb1;
  byte local_fb0;
  byte local_faf;
  byte local_fae;
  byte local_fad;
  byte local_fac;
  byte local_fab;
  byte local_faa;
  byte local_fa9;
  string local_fa8;
  Vector3 local_f88;
  Scalar d2;
  Scalar d1;
  Scalar d0;
  Point3 p2;
  Point3 p1;
  Point3 p6;
  Point3 p5;
  Point3 p4;
  Point3 p3;
  S_Superellipsoid super;
  S_Sphere sphere;
  S_Box box;
  CD_Pair pair2;
  CD_Pair pair3;
  CD_Pair pair1;
  
  *(undefined8 *)(sch::S_Box::~S_Box + *(long *)(std::cout + -0x18)) = 0xf;
  *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 0xf;
  sch::S_Box::S_Box(&box,0.2,0.1,0.4);
  _pair1 = 0x3fb999999999999a;
  _pair2 = (pointer)0x3fe6666666666666;
  _pair3 = 0.9;
  sch::S_Object::setPosition((double *)&box,(double *)&pair1,(double *)&pair2);
  _pair1 = 0x3fb999999999999a;
  _pair2 = (pointer)0x3ff0000000000000;
  _pair3 = 0.7;
  sch::S_Object::setOrientation((double *)&box,(double *)&pair1,(double *)&pair2);
  _pair1 = 0x3fd3333333333333;
  sch::S_Sphere::S_Sphere(&sphere,(double *)&pair1);
  _pair1 = 0x3fe0000000000000;
  _pair2 = (pointer)0x3fe999999999999a;
  _pair3 = 1.1;
  sch::S_Object::addScale((double *)&sphere,(double *)&pair1,(double *)&pair2);
  _pair1 = 0x3fb999999999999a;
  _pair2 = (pointer)0xbfe6666666666666;
  _pair3 = -0.9;
  sch::S_Object::setPosition((double *)&sphere,(double *)&pair1,(double *)&pair2);
  _pair1 = 0x3fe999999999999a;
  sch::S_Object::addRotation((double *)&sphere,(Vector3T *)&pair1);
  sch::CD_Pair::CD_Pair(&pair1,(S_Object *)&box,(S_Object *)&sphere);
  cVar1 = sch::CD_Pair::isInCollision();
  dVar18 = (double)sch::CD_Pair::getDistance();
  d0 = SQRT(ABS(dVar18));
  p1.m_x = 0.0;
  p1.m_y = 0.0;
  p1.m_z = 0.0;
  p2.m_x = 0.0;
  p2.m_y = 0.0;
  p2.m_z = 0.0;
  sch::CD_Pair::getClosestPoints((Vector3T *)&pair1,(Vector3T *)&p1);
  poVar9 = std::operator<<((ostream *)&std::cout,"First Query");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"Collision: ");
  pcVar12 = "False";
  pcVar14 = "False";
  if (cVar1 != '\0') {
    pcVar14 = "True";
  }
  poVar9 = std::operator<<(poVar9,pcVar14);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::operator<<((ostream *)&std::cout,"Distance: ");
  poVar9 = std::ostream::_M_insert<double>(d0);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"Witness points: ");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"P1: ");
  poVar9 = CD_Matrix::operator<<(poVar9,&p1);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"P2: ");
  poVar9 = CD_Matrix::operator<<(poVar9,&p2);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  _pair3 = 1.75797057738;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pair2,"First query, d0. ",(allocator<char> *)&super);
  bVar2 = compare<double>(&d0,(double *)&pair3,(string *)&pair2,1e-12);
  std::__cxx11::string::~string((string *)&pair2);
  _pair3 = 0.0292236259886;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pair2,"First query, p1. ",(allocator<char> *)&super);
  bVar3 = compare(&p1,(Vector3 *)&pair3,(string *)&pair2,1e-12);
  std::__cxx11::string::~string((string *)&pair2);
  _pair3 = 0.0239874216807;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pair2,"First query, p2. ",(allocator<char> *)&super);
  local_faa = bVar3;
  local_fa9 = bVar2;
  local_fab = compare(&p2,(Vector3 *)&pair3,(string *)&pair2,1e-12);
  std::__cxx11::string::~string((string *)&pair2);
  _pair2 = (pointer)0x0;
  _pair3 = 0.0;
  _super = 0;
  sch::S_Object::setPosition((double *)&box,(double *)&pair2,(double *)&pair3);
  _pair2 = (pointer)0x3f847ae147ae147b;
  _pair3 = 0.0;
  _super = 0;
  sch::S_Object::setPosition((double *)&sphere,(double *)&pair2,(double *)&pair3);
  cVar1 = sch::CD_Pair::isInCollision();
  dVar18 = (double)sch::CD_Pair::getDistanceWithoutPenetrationDepth();
  d1 = SQRT(ABS(dVar18));
  dVar18 = (double)sch::CD_Pair::getDistance();
  d2 = SQRT(ABS(dVar18));
  sch::CD_Pair::getClosestPoints((Vector3T *)&pair1,(Vector3T *)&p1);
  poVar9 = std::operator<<((ostream *)&std::cout,"Second Query");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"Collision: ");
  if (cVar1 != '\0') {
    pcVar12 = "True";
  }
  poVar9 = std::operator<<(poVar9,pcVar12);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::operator<<((ostream *)&std::cout,"Distance: ");
  poVar9 = std::ostream::_M_insert<double>(d1);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::operator<<((ostream *)&std::cout,"Depth: ");
  poVar9 = std::ostream::_M_insert<double>(d2);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"Witness points: ");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"P1: ");
  poVar9 = CD_Matrix::operator<<(poVar9,&p1);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"P2: ");
  poVar9 = CD_Matrix::operator<<(poVar9,&p2);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  _pair3 = 0.0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pair2,"Second query, d1. ",(allocator<char> *)&super);
  bVar2 = compare<double>(&d1,(double *)&pair3,(string *)&pair2,1e-12);
  std::__cxx11::string::~string((string *)&pair2);
  _pair3 = 0.293744618861213;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pair2,"Second query, d2. ",(allocator<char> *)&super);
  bVar3 = compare<double>(&d2,(double *)&pair3,(string *)&pair2,1e-12);
  std::__cxx11::string::~string((string *)&pair2);
  _pair3 = 0.0110146674327551;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pair2,"Second query, p1. ",(allocator<char> *)&super);
  local_fac = compare(&p1,(Vector3 *)&pair3,(string *)&pair2,1e-12);
  std::__cxx11::string::~string((string *)&pair2);
  _pair3 = -0.158401731667896;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pair2,"Second query, p2. ",(allocator<char> *)&super);
  local_fad = compare(&p2,(Vector3 *)&pair3,(string *)&pair2,1e-12);
  local_fae = bVar2;
  std::__cxx11::string::~string((string *)&pair2);
  sch::S_Superellipsoid::S_Superellipsoid(&super,0.1,0.9,0.3,0.5,0.8);
  _pair2 = (pointer)0x3fc999999999999a;
  _pair3 = 0.8;
  local_fa8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  sch::S_Object::setPosition((double *)&super,(double *)&pair2,(double *)&pair3);
  _pair2 = (pointer)0x3fc999999999999a;
  _pair3 = 1.7;
  local_fa8._M_dataplus._M_p = (pointer)0x3fe999999999999a;
  sch::S_Object::setOrientation((double *)&super,(double *)&pair2,(double *)&pair3);
  sch::CD_Pair::CD_Pair(&pair2,(S_Object *)&box,(S_Object *)&super);
  sch::CD_Pair::CD_Pair(&pair3,(S_Object *)&sphere,(S_Object *)&super);
  p3.m_x = 0.0;
  p3.m_y = 0.0;
  p3.m_z = 0.0;
  p4.m_x = 0.0;
  p4.m_y = 0.0;
  p4.m_z = 0.0;
  p5.m_x = 0.0;
  p5.m_y = 0.0;
  p5.m_z = 0.0;
  p6.m_x = 0.0;
  p6.m_y = 0.0;
  p6.m_z = 0.0;
  d0 = (Scalar)sch::CD_Pair::getClosestPoints((Vector3T *)&pair1,(Vector3T *)&p1);
  d1 = (Scalar)sch::CD_Pair::getClosestPoints((Vector3T *)&pair2,(Vector3T *)&p3);
  d2 = (Scalar)sch::CD_Pair::getClosestPoints((Vector3T *)&pair3,(Vector3T *)&p5);
  local_f88.m_x = -0.0862859011099191;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"Third Query, d0",&local_fb3);
  bVar2 = compare<double>(&d0,&local_f88.m_x,&local_fa8,1e-12);
  std::__cxx11::string::~string((string *)&local_fa8);
  local_f88.m_x = 0.0110146674327551;
  local_f88.m_y = -0.0498945075944604;
  local_f88.m_z = -0.0551780527427314;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"Third Query, p1",&local_fb3);
  local_faf = compare(&p1,&local_f88,&local_fa8,1e-12);
  std::__cxx11::string::~string((string *)&local_fa8);
  local_f88.m_x = -0.158401731667896;
  local_f88.m_y = 0.18954845401356;
  local_f88.m_z = -0.0393334018450828;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"Third Query, p2",&local_fb3);
  bVar4 = compare(&p2,&local_f88,&local_fa8,1e-12);
  std::__cxx11::string::~string((string *)&local_fa8);
  local_f88.m_x = 0.659596933491;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"Third Query, d1",&local_fb3);
  local_fb0 = compare<double>(&d1,&local_f88.m_x,&local_fa8,1e-12);
  std::__cxx11::string::~string((string *)&local_fa8);
  local_f88.m_x = 0.0707763740114;
  local_f88.m_y = 0.0985548629043;
  local_f88.m_z = 0.194364718711;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"Third Query, p3",&local_fb3);
  bVar5 = compare(&p3,&local_f88,&local_fa8,1e-12);
  std::__cxx11::string::~string((string *)&local_fa8);
  local_f88.m_x = 0.259412979986;
  local_f88.m_y = 0.301096580075;
  local_f88.m_z = 0.95790254828;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"Third Query, p4",&local_fb3);
  local_fb1 = compare(&p4,&local_f88,&local_fa8,1e-12);
  std::__cxx11::string::~string((string *)&local_fa8);
  local_f88.m_x = 0.516365498703901;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"Third Query, d2",&local_fb3);
  bVar6 = compare<double>(&d2,&local_f88.m_x,&local_fa8,1e-12);
  std::__cxx11::string::~string((string *)&local_fa8);
  local_f88.m_x = 0.126586144900461;
  local_f88.m_y = 0.0390218116062935;
  local_f88.m_z = 0.297048794226006;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"Third Query, p5",&local_fb3);
  local_fb2 = compare(&p5,&local_f88,&local_fa8,1e-12);
  std::__cxx11::string::~string((string *)&local_fa8);
  local_f88.m_x = 0.300323477842992;
  local_f88.m_y = 0.23919818987692;
  local_f88.m_z = 0.964963650647371;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"Third Query, p6",&local_fb3);
  bVar7 = compare(&p6,&local_f88,&local_fa8,1e-12);
  std::__cxx11::string::~string((string *)&local_fa8);
  poVar9 = std::operator<<((ostream *)&std::cout,"Third Query");
  std::endl<char,std::char_traits<char>>(poVar9);
  std::operator<<((ostream *)&std::cout,"Distance1 Squared: ");
  poVar9 = std::ostream::_M_insert<double>(d0);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"Witness points 1: ");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"P1: ");
  poVar9 = CD_Matrix::operator<<(poVar9,&p1);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"P2: ");
  poVar9 = CD_Matrix::operator<<(poVar9,&p2);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::operator<<((ostream *)&std::cout,"Distance2 Squared: ");
  poVar9 = std::ostream::_M_insert<double>(d1);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"Witness points 2: ");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"P1: ");
  poVar9 = CD_Matrix::operator<<(poVar9,&p3);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"P2: ");
  poVar9 = CD_Matrix::operator<<(poVar9,&p4);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::operator<<((ostream *)&std::cout,"Distance3 Squared: ");
  poVar9 = std::ostream::_M_insert<double>(d2);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"Witness points 3: ");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"P1: ");
  poVar9 = CD_Matrix::operator<<(poVar9,&p5);
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"P2: ");
  poVar9 = CD_Matrix::operator<<(poVar9,&p6);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  bVar8 = local_fa9 & local_faa;
  bVar10 = local_fab & local_fae;
  bVar15 = bVar3 & local_fac & local_fad;
  bVar17 = bVar2 & local_faf;
  bVar13 = bVar4 & local_fb0;
  bVar16 = bVar5 & local_fb1;
  bVar11 = bVar6 & local_fb2;
  sch::CD_Pair::~CD_Pair(&pair3);
  sch::CD_Pair::~CD_Pair(&pair2);
  sch::S_Superellipsoid::~S_Superellipsoid(&super);
  sch::CD_Pair::~CD_Pair(&pair1);
  sch::S_Sphere::~S_Sphere(&sphere);
  sch::S_Box::~S_Box(&box);
  return (uint)(byte)(bVar11 & bVar7 & bVar16 & bVar13 & bVar17 & bVar15 & bVar10 & bVar8 ^ 1);
}

Assistant:

int main(int /*argc*/, char * /*argv*/[])
{
#ifdef ENABLE_SIGFPE
  feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT);
#endif

  // Set output precision
  std::cout.precision(std::numeric_limits<double>::digits10);
  std::cerr.precision(std::numeric_limits<double>::digits10);

  //***********
  // Object initializations

  // A box with height, width and depth
  S_Box box(0.2, 0.1, 0.4);

  // Set the position in the world reference frame
  box.setPosition(0.1, 0.7, 0.9);

  // Set the orientation of the Object
  //(many different orientations representations are supported, here Roll
  //  pitch yaw)
  box.setOrientation(0.1, 1, 0.7);

  // A second object, a sphere with a radius
  S_Sphere sphere(0.3);

  // let's transform it into an ellipsoid
  // we add an anisotropic scale to the sphere
  //  (the scale has to be the first operation as it affects also
  //  rotations and translations)
  sphere.addScale(0.5, 0.8, 1.1);

  // Set the position in the world reference frame
  sphere.setPosition(0.1, -0.7, -0.9);

  // We turn it around the axis vrot defined by
  Vector3 vrot(0.2, 0.4, 0.5);
  vrot = vrot / vrot.norm();

  // let's turn it by 0.8 rad (we use addRotation instead of setRotation
  //  to not loose the scale)
  sphere.addRotation(0.8, vrot);

  //********
  // Proximity queries

  // Create a proximity-query pair of objects. It takes the addresses of the
  // objects. The user is responsible of guaranteeing the existance of the
  // objects at these addresses during all the period of use of the pair and
  // desrtoying the objects at the end.
  // Note that STL containers (vectors, deque, etc.) do not guarantee that
  // objects remain at same address. Use them with care.
  CD_Pair pair1(&box, &sphere);

  // Are they in collision ?
  // This is the fastest proximity query as it runs GJK with the lowest
  //  precision
  Scalar collision = pair1.isInCollision();

  // This runs GJK with 1e-6 precision.
  //  WARNING : THE PROVIDED DISTANCE IS SQUARED for computation time
  //  purpose, the real distance is then obtained by square root
  //  this algorithm takes profit from the warm start provided by the
  //  previous query, so there is virtually no additional cost at making
  //  these two requests instead of directly the last one.
  //  if there is a collision, this will compute the penetration depth
  Scalar d0 = sqrt(fabs(pair1.getDistance()));

  // Our witness points
  Point3 p1, p2;
  // get the Witness points without running GJK or depth computation again
  //  (it detects that the object did not move since the last query, if
  //  one or both moved, this query would trigger GJK algorithm).
  //  this method returns the distance also.
  pair1.getClosestPoints(p1, p2);

  // Let's display all this stuff
  std::cout << "First Query" << std::endl;
  std::cout << "Collision: " << (collision ? "True" : "False") << std::endl;
  std::cout << "Distance: " << d0 << std::endl;
  std::cout << "Witness points: " << std::endl;
  std::cout << "P1: " << p1 << std::endl;
  std::cout << "P2: " << p2 << std::endl;
  std::cout << std::endl;

  // compare the results for first query
  bool comparison = true;
  comparison = compare(d0, 1.75797057738, "First query, d0. ") && comparison;
  comparison =
      compare(p1, (Vector3(0.0292236259886, 0.601445137096, 0.705635281289)), "First query, p1. ") && comparison;
  comparison =
      compare(p2, (Vector3(0.0239874216807, -0.336387177086, -0.781275504057)), "First query, p2. ") && comparison;

  // Now we move the objects to enter in collision
  // We avoid symmetries to always get the same witness points.
  box.setPosition(0, 0, 0);
  sphere.setPosition(0.01, 0, 0);

  // Query again
  collision = pair1.isInCollision();

  // Let's run again the Distance computation, but not the penetration
  // depth, because the last algorithm is much slower, if there is a
  // collision, the output would be zero
  //
  Scalar d1 = sqrt(fabs(pair1.getDistanceWithoutPenetrationDepth()));

  // We call now the regular distance query (collision will trigger
  // depth query and the distance will be given in negative to distinguish
  //  it from separating distance)
  Scalar d2 = sqrt(fabs(pair1.getDistance()));

  // Our witness points
  pair1.getClosestPoints(p1, p2);

  // Let's display all this stuff
  std::cout << "Second Query" << std::endl;
  std::cout << "Collision: " << (collision ? "True" : "False") << std::endl;
  std::cout << "Distance: " << d1 << std::endl;
  std::cout << "Depth: " << d2 << std::endl;
  std::cout << "Witness points: " << std::endl;
  std::cout << "P1: " << p1 << std::endl;
  std::cout << "P2: " << p2 << std::endl;
  std::cout << std::endl;

  // compare the results for second query
  comparison = compare(d1, 0., "Second query, d1. ") && comparison;
#ifdef SCH_BUILD_BSD
  comparison = compare(d2, 0., "Second query, d2. ") && comparison;
  comparison =
      compare(p1, (Vector3(-0.211100297803413, -0.0866553324786505, -0.0206764992279858)), "Second query, p1. ")
      && comparison;
  comparison = compare(p2, (Vector3(0.201035958824805, -0.171232378087511, 0.066080909954798)), "Second query, p2. ")
               && comparison;
#else
  comparison = compare(d2, 0.293744618861213, "Second query, d2. ") && comparison;
  comparison =
      compare(p1, (Vector3(0.0110146674327551, -0.0498945075944604, -0.0551780527427314)), "Second query, p1. ")
      && comparison;
  comparison = compare(p2, (Vector3(-0.158401731667896, 0.18954845401356, -0.0393334018450828)), "Second query, p2. ")
               && comparison;
#endif

  //******************
  // More objects

  // Create the third object
  //  A superellipsoid with height, width, depth, epsilon1, epsilon2
  S_Superellipsoid super(0.1, 0.9, 0.3, 0.5, 0.8);

  // Position/Orientation
  super.setPosition(0.2, 0.8, 1);
  super.setOrientation(0.2, 1.7, 0.8);

  // Creation of new pairs related to the new objects. Each pair of 3D objects
  // is then a C++ objects
  CD_Pair pair2(&box, &super);
  CD_Pair pair3(&sphere, &super);

  // Our witness points
  Point3 p3, p4, p5, p6;

  // We can directly ask for the closest points
  // When the returned value is negative, it is the opposite of the squared
  // depth.
  d0 = pair1.getClosestPoints(p1, p2);
  d1 = pair2.getClosestPoints(p3, p4);
  d2 = pair3.getClosestPoints(p5, p6);

  // compare the results for third query
#ifdef SCH_BUILD_BSD
  comparison = compare(d0, 0., "Third Query, d0") && comparison;
  comparison = compare(p1, (Vector3(-0.211100297803413, -0.0866553324786505, -0.0206764992279858)), "Third Query, p1")
               && comparison;
  comparison =
      compare(p2, (Vector3(0.201035958824805, -0.171232378087511, 0.066080909954798)), "Third Query, p2") && comparison;
#else
  comparison = compare(d0, -0.0862859011099191, "Third Query, d0") && comparison;
  comparison = compare(p1, (Vector3(0.0110146674327551, -0.0498945075944604, -0.0551780527427314)), "Third Query, p1")
               && comparison;
  comparison = compare(p2, (Vector3(-0.158401731667896, 0.18954845401356, -0.0393334018450828)), "Third Query, p2")
               && comparison;
#endif

  comparison = compare(d1, 0.659596933491, "Third Query, d1") && comparison;
  comparison =
      compare(p3, (Vector3(0.0707763740114, 0.0985548629043, 0.194364718711)), "Third Query, p3") && comparison;
  comparison = compare(p4, (Vector3(0.259412979986, 0.301096580075, 0.95790254828)), "Third Query, p4") && comparison;

  comparison = compare(d2, 0.516365498703901, "Third Query, d2") && comparison;
  comparison = compare(p5, (sch::Vector3(0.126586144900461, 0.0390218116062935, 0.297048794226006)), "Third Query, p5")
               && comparison;
  comparison = compare(p6, (sch::Vector3(0.300323477842992, 0.23919818987692, 0.964963650647371)), "Third Query, p6")
               && comparison;

  // Let's display all this stuff
  std::cout << "Third Query" << std::endl;
  std::cout << "Distance1 Squared: " << d0 << std::endl;
  std::cout << "Witness points 1: " << std::endl;
  std::cout << "P1: " << p1 << std::endl;
  std::cout << "P2: " << p2 << std::endl;
  std::cout << "Distance2 Squared: " << d1 << std::endl;
  std::cout << "Witness points 2: " << std::endl;
  std::cout << "P1: " << p3 << std::endl;
  std::cout << "P2: " << p4 << std::endl;
  std::cout << "Distance3 Squared: " << d2 << std::endl;
  std::cout << "Witness points 3: " << std::endl;
  std::cout << "P1: " << p5 << std::endl;
  std::cout << "P2: " << p6 << std::endl;
  std::cout << std::endl;

  return (comparison ? 0 : 1);
  // That's all folks
}